

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::trimLeft
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,StringRef *charSet)

{
  size_t sVar1;
  
  sVar1 = StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::findNotOneOf
                    (&this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>,charSet,0);
  if (sVar1 == 0xffffffffffffffff) {
    clear(this);
    sVar1 = 0;
  }
  else {
    (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p =
         (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p + sVar1;
    sVar1 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length - sVar1;
    (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length = sVar1;
  }
  return sVar1;
}

Assistant:

size_t
	trimLeft(const StringRef& charSet) {
		size_t i = this->findNotOneOf(charSet);
		if (i == -1) {
			clear();
			return 0;
		}

		this->m_p += i;
		this->m_length -= i;
		return this->m_length;
	}